

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

Wlc_Ntk_t * Wlc_ReadVer(char *pFileName,char *pStr)

{
  int iVar1;
  Wlc_Prs_t *p;
  Wlc_Obj_t *pWVar2;
  Wlc_Ntk_t *pWVar3;
  char *pcVar4;
  
  if ((pFileName == (char *)0x0) != (pStr != (char *)0x0)) {
    __assert_fail("(pFileName == NULL) != (pStr == NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadVer.c"
                  ,0x69a,"Wlc_Ntk_t *Wlc_ReadVer(char *, char *)");
  }
  p = Wlc_PrsStart(pFileName,pStr);
  if (p != (Wlc_Prs_t *)0x0) {
    iVar1 = Wlc_PrsPrepare(p);
    if (((iVar1 == 0) || (iVar1 = Wlc_PrsDerive(p), iVar1 == 0)) ||
       (pWVar3 = p->pNtk, pWVar3 == (Wlc_Ntk_t *)0x0)) {
      pWVar3 = (Wlc_Ntk_t *)0x0;
    }
    else {
      for (iVar1 = 1; iVar1 < pWVar3->iObj; iVar1 = iVar1 + 1) {
        pWVar2 = Wlc_NtkObj(pWVar3,iVar1);
        if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x5) {
          Vec_IntPush(&p->pNtk->vFfs2,(int)(((long)pWVar2 - (long)p->pNtk->pObjs) / 0x18));
        }
        pWVar3 = p->pNtk;
      }
      pWVar3 = Wlc_NtkDupDfs(pWVar3,0,1);
      pcVar4 = Abc_UtilStrsav(pFileName);
      pWVar3->pSpec = pcVar4;
    }
    Wlc_PrsPrintErrorMessage(p);
    Wlc_PrsStop(p);
    return pWVar3;
  }
  return (Wlc_Ntk_t *)0x0;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadVer( char * pFileName, char * pStr )
{
    Wlc_Prs_t * p;
    Wlc_Ntk_t * pNtk = NULL;
    // either file name or string is given
    assert( (pFileName == NULL) != (pStr == NULL) );
    // start the parser 
    p = Wlc_PrsStart( pFileName, pStr );
    if ( p == NULL )
        return NULL;
    // detect lines
    if ( !Wlc_PrsPrepare( p ) )
        goto finish;
    // parse models
    if ( !Wlc_PrsDerive( p ) )
        goto finish;
    // derive topological order
    if ( p->pNtk )
    {
        Wlc_Obj_t * pObj; int i;
        Wlc_NtkForEachObj( p->pNtk, pObj, i )
            if ( pObj->Type == WLC_OBJ_FF )
                Vec_IntPush( &p->pNtk->vFfs2, Wlc_ObjId(p->pNtk, pObj) );
        pNtk = Wlc_NtkDupDfs( p->pNtk, 0, 1 );
        pNtk->pSpec = Abc_UtilStrsav( pFileName );
    }
finish:
    Wlc_PrsPrintErrorMessage( p );
    Wlc_PrsStop( p );
    return pNtk;
}